

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_179e6c::DebGenerator::DebGenerator
          (DebGenerator *this,cmCPackLog *logger,string *outputName,string *workDir,
          string *topLevelDir,string *temporaryDir,cmValue debCompressionType,cmValue numThreads,
          cmValue debianArchiveType,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          controlValues,bool genShLibs,string shLibsFilename,bool genPostInst,string postInst,
          bool genPostRm,string postRm,cmValue controlExtra,bool permissionStrictPolicy,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          packageFiles)

{
  string *psVar1;
  long *value;
  cmCPackLog *pcVar2;
  pointer pbVar3;
  bool bVar4;
  ostream *poVar5;
  undefined7 in_stack_00000051;
  string debianCompressionType;
  char *local_1c8 [4];
  ostringstream cmCPackLog_msg;
  
  this->Logger = logger;
  std::__cxx11::string::string((string *)&this->OutputName,(string *)outputName);
  std::__cxx11::string::string((string *)&this->WorkDir,(string *)workDir);
  (this->CompressionSuffix)._M_dataplus._M_p = (pointer)&(this->CompressionSuffix).field_2;
  (this->CompressionSuffix)._M_string_length = 0;
  psVar1 = &this->CompressionSuffix;
  (this->CompressionSuffix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->TopLevelDir,(string *)topLevelDir);
  std::__cxx11::string::string((string *)&this->TemporaryDir,(string *)temporaryDir);
  if (debianArchiveType.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&this->DebianArchiveType,"gnutar",(allocator<char> *)&cmCPackLog_msg);
  }
  else {
    std::__cxx11::string::string
              ((string *)&this->DebianArchiveType,(string *)debianArchiveType.Value);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->ControlValues)._M_t._M_impl.super__Rb_tree_header,
             (_Rb_tree_header *)(controlValues._M_t._M_impl._0_8_ + 8));
  this->GenShLibs =
       (bool)(undefined1)controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  std::__cxx11::string::string
            ((string *)&this->ShLibsFilename,
             (string *)controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  this->GenPostInst = controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_;
  std::__cxx11::string::string
            ((string *)&this->PostInst,
             (string *)controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  this->GenPostRm = controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_;
  std::__cxx11::string::string
            ((string *)&this->PostRm,(string *)CONCAT71(in_stack_00000051,genShLibs));
  (this->ControlExtra).Value = (string *)shLibsFilename._M_dataplus._M_p;
  this->PermissionStrictPolicy = shLibsFilename._M_string_length._0_1_;
  pbVar3 = *(pointer *)(shLibsFilename.field_2._M_allocated_capacity + 8);
  (this->PackageFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)shLibsFilename.field_2._M_allocated_capacity;
  (this->PackageFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->PackageFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)(shLibsFilename.field_2._M_allocated_capacity + 0x10);
  *(undefined8 *)shLibsFilename.field_2._M_allocated_capacity = 0;
  *(undefined8 *)(shLibsFilename.field_2._M_allocated_capacity + 8) = 0;
  *(undefined8 *)(shLibsFilename.field_2._M_allocated_capacity + 0x10) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debianCompressionType,"gzip",(allocator<char> *)&cmCPackLog_msg);
  if (debCompressionType.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&debianCompressionType);
  }
  bVar4 = std::operator==(&debianCompressionType,"lzma");
  if (bVar4) {
    std::__cxx11::string::assign((char *)psVar1);
    this->TarCompressionType = CompressLZMA;
  }
  else {
    bVar4 = std::operator==(&debianCompressionType,"xz");
    if (bVar4) {
      std::__cxx11::string::assign((char *)psVar1);
      this->TarCompressionType = CompressXZ;
    }
    else {
      bVar4 = std::operator==(&debianCompressionType,"bzip2");
      if (bVar4) {
        std::__cxx11::string::assign((char *)psVar1);
        this->TarCompressionType = CompressBZip2;
      }
      else {
        bVar4 = std::operator==(&debianCompressionType,"gzip");
        if (bVar4) {
          std::__cxx11::string::assign((char *)psVar1);
          this->TarCompressionType = CompressGZip;
        }
        else {
          bVar4 = std::operator==(&debianCompressionType,"zstd");
          if (bVar4) {
            std::__cxx11::string::assign((char *)psVar1);
            this->TarCompressionType = CompressZstd;
          }
          else {
            bVar4 = std::operator==(&debianCompressionType,"none");
            if (bVar4) {
              (this->CompressionSuffix)._M_string_length = 0;
              *(this->CompressionSuffix)._M_dataplus._M_p = '\0';
              this->TarCompressionType = CompressNone;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                                       "Error unrecognized compression type: ");
              poVar5 = std::operator<<(poVar5,(string *)&debianCompressionType);
              std::endl<char,std::char_traits<char>>(poVar5);
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                              ,0x7d,local_1c8[0]);
              std::__cxx11::string::~string((string *)local_1c8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            }
          }
        }
      }
    }
  }
  value = &this->NumThreads;
  if (numThreads.Value == (string *)0x0) {
    *value = 1;
  }
  else {
    bVar4 = cmStrToLong(numThreads.Value,value);
    if (!bVar4) {
      *value = 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Unrecognized number of threads: ");
      poVar5 = operator<<(poVar5,numThreads);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x85,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::~string((string *)&debianCompressionType);
  return;
}

Assistant:

DebGenerator::DebGenerator(
  cmCPackLog* logger, std::string outputName, std::string workDir,
  std::string topLevelDir, std::string temporaryDir,
  cmValue debCompressionType, cmValue numThreads, cmValue debianArchiveType,
  std::map<std::string, std::string> controlValues, bool genShLibs,
  std::string shLibsFilename, bool genPostInst, std::string postInst,
  bool genPostRm, std::string postRm, cmValue controlExtra,
  bool permissionStrictPolicy, std::vector<std::string> packageFiles)
  : Logger(logger)
  , OutputName(std::move(outputName))
  , WorkDir(std::move(workDir))
  , TopLevelDir(std::move(topLevelDir))
  , TemporaryDir(std::move(temporaryDir))
  , DebianArchiveType(debianArchiveType ? *debianArchiveType : "gnutar")
  , ControlValues(std::move(controlValues))
  , GenShLibs(genShLibs)
  , ShLibsFilename(std::move(shLibsFilename))
  , GenPostInst(genPostInst)
  , PostInst(std::move(postInst))
  , GenPostRm(genPostRm)
  , PostRm(std::move(postRm))
  , ControlExtra(controlExtra)
  , PermissionStrictPolicy(permissionStrictPolicy)
  , PackageFiles(std::move(packageFiles))
{
  std::string debianCompressionType = "gzip";
  if (debCompressionType) {
    debianCompressionType = *debCompressionType;
  }

  if (debianCompressionType == "lzma") {
    this->CompressionSuffix = ".lzma";
    this->TarCompressionType = cmArchiveWrite::CompressLZMA;
  } else if (debianCompressionType == "xz") {
    this->CompressionSuffix = ".xz";
    this->TarCompressionType = cmArchiveWrite::CompressXZ;
  } else if (debianCompressionType == "bzip2") {
    this->CompressionSuffix = ".bz2";
    this->TarCompressionType = cmArchiveWrite::CompressBZip2;
  } else if (debianCompressionType == "gzip") {
    this->CompressionSuffix = ".gz";
    this->TarCompressionType = cmArchiveWrite::CompressGZip;
  } else if (debianCompressionType == "zstd") {
    this->CompressionSuffix = ".zst";
    this->TarCompressionType = cmArchiveWrite::CompressZstd;
  } else if (debianCompressionType == "none") {
    this->CompressionSuffix.clear();
    this->TarCompressionType = cmArchiveWrite::CompressNone;
  } else {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error unrecognized compression type: "
                    << debianCompressionType << std::endl);
  }

  if (numThreads) {
    if (!cmStrToLong(*numThreads, &this->NumThreads)) {
      this->NumThreads = 1;
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Unrecognized number of threads: " << numThreads
                                                       << std::endl);
    }
  } else {
    this->NumThreads = 1;
  }
}